

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::MultiThreadedObjectTest::pullObjectsFromShared
          (MultiThreadedObjectTest *this,TestThread *thread,int pbufferCount,int pixmapCount,
          int windowCount,int contextCount)

{
  pointer *pppvVar1;
  pointer ppvVar2;
  pointer ppvVar3;
  iterator iVar4;
  pointer ppVar5;
  iterator __position;
  pointer ppVar6;
  iterator __position_00;
  void *pvVar7;
  deUint32 dVar8;
  deRandom *rnd;
  pointer ppVar9;
  pointer ppVar10;
  vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
  *this_00;
  void **ppvVar11;
  pair<eglu::NativePixmap_*,_void_*> *__args;
  pointer ppVar12;
  pair<eglu::NativeWindow_*,_void_*> *__args_00;
  pointer ppVar13;
  vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
  *this_01;
  pointer ppvVar14;
  long lVar15;
  vector<void*,std::allocator<void*>> *this_02;
  long lVar16;
  vector<void*,std::allocator<void*>> *this_03;
  int iVar17;
  
  iVar17 = thread->m_id;
  this_02 = (vector<void*,std::allocator<void*>> *)&this->m_contexts0;
  if (iVar17 != 0) {
    this_02 = (vector<void*,std::allocator<void*>> *)&this->m_contexts1;
  }
  this_01 = (vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
             *)&this->m_nativePixmaps1;
  if (iVar17 == 0) {
    this_01 = (vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
               *)&this->m_nativePixmaps0;
  }
  this_00 = (vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
             *)&this->m_nativeWindows1;
  if (iVar17 == 0) {
    this_00 = (vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
               *)&this->m_nativeWindows0;
  }
  this_03 = (vector<void*,std::allocator<void*>> *)&this->m_pbuffers1;
  if (iVar17 == 0) {
    this_03 = (vector<void*,std::allocator<void*>> *)&this->m_pbuffers0;
  }
  rnd = &(&this->m_rnd0)[iVar17 != 0].m_rnd;
  if (0 < pbufferCount) {
    do {
      ppvVar2 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      ppvVar3 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      dVar8 = deRandom_getUint32(rnd);
      lVar16 = (long)(int)((ulong)dVar8 % ((ulong)((long)ppvVar2 - (long)ppvVar3) >> 3 & 0xffffffff)
                          );
      ppvVar11 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar16;
      iVar4._M_current = *(void ***)(this_03 + 8);
      if (iVar4._M_current == *(void ***)(this_03 + 0x10)) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  (this_03,iVar4,ppvVar11);
      }
      else {
        *iVar4._M_current = *ppvVar11;
        *(long *)(this_03 + 8) = *(long *)(this_03 + 8) + 8;
      }
      ppvVar2 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      ppvVar3 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      ppvVar14 = ppvVar2 + lVar16 + 1;
      if (ppvVar14 != ppvVar3) {
        memmove(ppvVar2 + lVar16,ppvVar14,(long)ppvVar3 - (long)ppvVar14);
      }
      pppvVar1 = &(this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + -1;
      pbufferCount = pbufferCount + -1;
    } while (pbufferCount != 0);
  }
  if (0 < pixmapCount) {
    iVar17 = 0;
    do {
      ppVar9 = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar5 = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar8 = deRandom_getUint32(rnd);
      lVar16 = (long)(int)((ulong)dVar8 % ((ulong)((long)ppVar9 - (long)ppVar5) >> 4 & 0xffffffff));
      __args = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar16;
      __position._M_current = *(pair<eglu::NativePixmap_*,_void_*> **)(this_01 + 8);
      if (__position._M_current == *(pair<eglu::NativePixmap_*,_void_*> **)(this_01 + 0x10)) {
        std::
        vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
        ::_M_realloc_insert<std::pair<eglu::NativePixmap*,void*>const&>(this_01,__position,__args);
      }
      else {
        pvVar7 = __args->second;
        (__position._M_current)->first = __args->first;
        (__position._M_current)->second = pvVar7;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x10;
      }
      ppVar9 = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar12 = ppVar9 + lVar16 + 1;
      if ((ppVar12 != ppVar5) && (lVar15 = (long)ppVar5 - (long)ppVar12 >> 4, 0 < lVar15)) {
        ppVar9 = ppVar9 + lVar16;
        lVar15 = lVar15 + 1;
        do {
          ppVar9->first = ppVar12->first;
          ppVar9->second = ppVar12->second;
          ppVar12 = ppVar12 + 1;
          ppVar9 = ppVar9 + 1;
          lVar15 = lVar15 + -1;
        } while (1 < lVar15);
      }
      (this->m_sharedNativePixmaps).
      super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
      iVar17 = iVar17 + 1;
    } while (iVar17 != pixmapCount);
  }
  if (0 < windowCount) {
    iVar17 = 0;
    do {
      ppVar10 = (this->m_sharedNativeWindows).
                super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar6 = (this->m_sharedNativeWindows).
               super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar8 = deRandom_getUint32(rnd);
      lVar16 = (long)(int)((ulong)dVar8 % ((ulong)((long)ppVar10 - (long)ppVar6) >> 4 & 0xffffffff))
      ;
      __args_00 = (this->m_sharedNativeWindows).
                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar16;
      __position_00._M_current = *(pair<eglu::NativeWindow_*,_void_*> **)(this_00 + 8);
      if (__position_00._M_current == *(pair<eglu::NativeWindow_*,_void_*> **)(this_00 + 0x10)) {
        std::
        vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
        ::_M_realloc_insert<std::pair<eglu::NativeWindow*,void*>const&>
                  (this_00,__position_00,__args_00);
      }
      else {
        pvVar7 = __args_00->second;
        (__position_00._M_current)->first = __args_00->first;
        (__position_00._M_current)->second = pvVar7;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      ppVar10 = (this->m_sharedNativeWindows).
                super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 = (this->m_sharedNativeWindows).
               super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar13 = ppVar10 + lVar16 + 1;
      if ((ppVar13 != ppVar6) && (lVar15 = (long)ppVar6 - (long)ppVar13 >> 4, 0 < lVar15)) {
        ppVar10 = ppVar10 + lVar16;
        lVar15 = lVar15 + 1;
        do {
          ppVar10->first = ppVar13->first;
          ppVar10->second = ppVar13->second;
          ppVar13 = ppVar13 + 1;
          ppVar10 = ppVar10 + 1;
          lVar15 = lVar15 + -1;
        } while (1 < lVar15);
      }
      (this->m_sharedNativeWindows).
      super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar6 + -1;
      iVar17 = iVar17 + 1;
    } while (iVar17 != windowCount);
  }
  if (0 < contextCount) {
    do {
      ppvVar2 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      ppvVar3 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      dVar8 = deRandom_getUint32(rnd);
      lVar16 = (long)(int)((ulong)dVar8 % ((ulong)((long)ppvVar2 - (long)ppvVar3) >> 3 & 0xffffffff)
                          );
      ppvVar11 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar16;
      iVar4._M_current = *(void ***)(this_02 + 8);
      if (iVar4._M_current == *(void ***)(this_02 + 0x10)) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  (this_02,iVar4,ppvVar11);
      }
      else {
        *iVar4._M_current = *ppvVar11;
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
      }
      ppvVar2 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      ppvVar3 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      ppvVar14 = ppvVar2 + lVar16 + 1;
      if (ppvVar14 != ppvVar3) {
        memmove(ppvVar2 + lVar16,ppvVar14,(long)ppvVar3 - (long)ppvVar14);
      }
      pppvVar1 = &(this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + -1;
      contextCount = contextCount + -1;
    } while (contextCount != 0);
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::pullObjectsFromShared (TestThread& thread, int pbufferCount, int pixmapCount, int windowCount, int contextCount)
{
	de::Random&											rnd			= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < pbufferCount; pbufferNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedPbuffers.size()-1));

		pbuffers.push_back(m_sharedPbuffers[ndx]);
		m_sharedPbuffers.erase(m_sharedPbuffers.begin() + ndx);
	}

	for (int pixmapNdx = 0; pixmapNdx < pixmapCount; pixmapNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1));

		pixmaps.push_back(m_sharedNativePixmaps[ndx]);
		m_sharedNativePixmaps.erase(m_sharedNativePixmaps.begin() + ndx);
	}

	for (int windowNdx = 0; windowNdx < windowCount; windowNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1));

		windows.push_back(m_sharedNativeWindows[ndx]);
		m_sharedNativeWindows.erase(m_sharedNativeWindows.begin() + ndx);
	}

	for (int contextNdx = 0; contextNdx < contextCount; contextNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedContexts.size()-1));

		contexts.push_back(m_sharedContexts[ndx]);
		m_sharedContexts.erase(m_sharedContexts.begin() + ndx);
	}
}